

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_SpawnMissileXYZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  PClassActor *type;
  VMValue *pVVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar7;
  VMValue *pVVar8;
  AActor *pAVar9;
  PClassActor *pPVar10;
  VMValue *pVVar11;
  AActor *dest;
  char *pcVar12;
  bool bVar13;
  DVector3 local_48;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar9 = (AActor *)(param->field_0).field_1.a;
      if (pAVar9 != (AActor *)0x0) {
        if ((pAVar9->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(pAVar9->super_DThinker).super_DObject._vptr_DObject)(pAVar9);
          (pAVar9->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
        }
        pPVar7 = (pAVar9->super_DThinker).super_DObject.Class;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar13) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar13 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0043086e;
        }
      }
      if (numparam == 1) {
        pcVar12 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar12 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar12 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar12 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\x03') {
                      pvVar1 = param[1].field_0.field_1.a;
                      pvVar2 = param[2].field_0.field_1.a;
                      pvVar3 = param[3].field_0.field_1.a;
                      if ((param[4].field_0.field_1.atag == 1) ||
                         (param[4].field_0.field_1.a == (void *)0x0)) {
                        dest = (AActor *)param[4].field_0.field_1.a;
                        if (dest == (AActor *)0x0) {
                          NullParam("\"dest\"");
                          dest = (AActor *)param[4].field_0.field_1.a;
                        }
                        pPVar5 = AActor::RegistrationInfo.MyClass;
                        if (dest != (AActor *)0x0) {
                          if ((dest->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                            iVar6 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
                            (dest->super_DThinker).super_DObject.Class =
                                 (PClass *)CONCAT44(extraout_var_00,iVar6);
                          }
                          pPVar7 = (dest->super_DThinker).super_DObject.Class;
                          bVar13 = pPVar7 != (PClass *)0x0;
                          if (pPVar7 != pPVar5 && bVar13) {
                            do {
                              pPVar7 = pPVar7->ParentClass;
                              bVar13 = pPVar7 != (PClass *)0x0;
                              if (pPVar7 == pPVar5) break;
                            } while (pPVar7 != (PClass *)0x0);
                          }
                          if (!bVar13) {
                            pcVar12 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
                            goto LAB_0043088d;
                          }
                        }
                        if (numparam == 5) {
                          pcVar12 = "(paramnum) < numparam";
                        }
                        else {
                          if ((param[5].field_0.field_3.Type == '\x03') &&
                             ((param[5].field_0.field_1.atag == 1 ||
                              (param[5].field_0.field_1.a == (void *)0x0)))) {
                            type = (PClassActor *)param[5].field_0.field_1.a;
                            if ((type != (PClassActor *)0x0) &&
                               (pPVar10 = type,
                               type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                              do {
                                pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
                                if (pPVar10 == (PClassActor *)AActor::RegistrationInfo.MyClass)
                                break;
                              } while (pPVar10 != (PClassActor *)0x0);
                              if (pPVar10 == (PClassActor *)0x0) {
                                pcVar12 = 
                                "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
                                goto LAB_004308ea;
                              }
                            }
                            if (numparam < 7) {
                              pVVar8 = defaultparam->Array;
                              if (pVVar8[6].field_0.field_3.Type != '\0') {
                                pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
                                goto LAB_004308cb;
                              }
                            }
                            else {
                              pVVar8 = param;
                              if (param[6].field_0.field_3.Type != '\0') {
                                pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_004308cb:
                                __assert_fail(pcVar12,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                              ,0x1968,
                                              "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                             );
                              }
                            }
                            if (numparam < 8) {
                              pVVar4 = defaultparam->Array;
                              if ((pVVar4[7].field_0.field_3.Type == '\x03') &&
                                 ((pVVar11 = pVVar4 + 7, pVVar4[7].field_0.field_1.atag == 1 ||
                                  ((pVVar11->field_0).field_1.a == (void *)0x0))))
                              goto LAB_00430729;
                              pcVar12 = 
                              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                              ;
                            }
                            else {
                              if ((param[7].field_0.field_3.Type == '\x03') &&
                                 ((pVVar11 = param + 7, param[7].field_0.field_1.atag == 1 ||
                                  ((pVVar11->field_0).field_1.a == (void *)0x0)))) {
LAB_00430729:
                                local_48.X = (double)pvVar1;
                                local_48.Y = (double)pvVar2;
                                local_48.Z = (double)pvVar3;
                                pAVar9 = P_SpawnMissileXYZ(&local_48,pAVar9,dest,type,
                                                           pVVar8[6].field_0.i != 0,
                                                           (AActor *)(pVVar11->field_0).field_1.a);
                                if (numret < 1) {
                                  iVar6 = 0;
                                }
                                else {
                                  if (ret == (VMReturn *)0x0) {
                                    __assert_fail("ret != NULL",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                                  ,0x196a,
                                                  "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                                 );
                                  }
                                  iVar6 = 1;
                                  VMReturn::SetPointer(ret,pAVar9,1);
                                }
                                return iVar6;
                              }
                              pcVar12 = 
                              "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                              ;
                            }
                            __assert_fail(pcVar12,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                          ,0x1969,
                                          "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                          pcVar12 = 
                          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                          ;
                        }
LAB_004308ea:
                        __assert_fail(pcVar12,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                      ,0x1967,
                                      "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                     );
                      }
                    }
                    pcVar12 = 
                    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ;
                  }
LAB_0043088d:
                  __assert_fail(pcVar12,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                ,0x1966,
                                "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar12 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1965,
                            "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar12 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1964,
                        "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar12 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1963,
                    "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0043086e:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1962,
                "int AF_AActor_SpawnMissileXYZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileXYZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_BOOL_DEF(check);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileXYZ(DVector3(x,y,z), self, dest, type, check, owner));
}